

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O1

void BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits,ContextType literal_context_mode,Command *commands,
               size_t n_commands,MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  HuffmanTree *tree;
  ulong uVar8;
  uint uVar9;
  size_t sVar10;
  size_t sVar11;
  HistogramCommand *histogram;
  size_t j;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  size_t sVar18;
  ulong uVar19;
  long lVar20;
  HistogramLiteral *histogram_00;
  HistogramDistance *histogram_01;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;
  ulong local_ba0;
  BlockEncoder local_b58;
  BlockEncoder local_7a0;
  BlockEncoder local_3e8;
  
  uVar16 = (ulong)prev_byte;
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  local_b58.block_types_ = (mb->literal_split).types;
  local_b58.block_lengths_ = (mb->literal_split).lengths;
  local_b58.num_block_types_ = (mb->literal_split).num_types;
  local_b58.num_blocks_ = (mb->literal_split).num_blocks;
  local_b58.alphabet_size_ = 0x100;
  local_b58.block_split_code_.type_code_calculator.last_type = 1;
  local_b58.block_len_ = 0;
  local_b58.block_split_code_.type_code_calculator.second_last_type = 0;
  local_b58.block_ix_ = 0;
  if (local_b58.num_blocks_ != 0) {
    local_b58.block_len_ = (size_t)*local_b58.block_lengths_;
  }
  local_b58.entropy_ix_ = 0;
  local_b58.depths_ = (uint8_t *)0x0;
  local_7a0.block_len_ = 0;
  local_b58.bits_ = (uint16_t *)0x0;
  local_7a0.block_types_ = (mb->command_split).types;
  local_7a0.block_lengths_ = (mb->command_split).lengths;
  local_7a0.num_block_types_ = (mb->command_split).num_types;
  local_7a0.num_blocks_ = (mb->command_split).num_blocks;
  local_7a0.alphabet_size_ = 0x2c0;
  local_7a0.block_split_code_.type_code_calculator.last_type = 1;
  local_7a0.block_split_code_.type_code_calculator.second_last_type = 0;
  local_7a0.block_ix_ = 0;
  if (local_7a0.num_blocks_ != 0) {
    local_7a0.block_len_ = (size_t)*local_7a0.block_lengths_;
  }
  local_7a0.entropy_ix_ = 0;
  local_7a0.depths_ = (uint8_t *)0x0;
  local_3e8.block_len_ = 0;
  local_7a0.bits_ = (uint16_t *)0x0;
  local_3e8.block_types_ = (mb->distance_split).types;
  local_3e8.block_lengths_ = (mb->distance_split).lengths;
  local_3e8.num_block_types_ = (mb->distance_split).num_types;
  local_3e8.num_blocks_ = (mb->distance_split).num_blocks;
  local_3e8.block_split_code_.type_code_calculator.last_type = 1;
  local_3e8.block_split_code_.type_code_calculator.second_last_type = 0;
  local_3e8.block_ix_ = 0;
  if (local_3e8.num_blocks_ != 0) {
    local_3e8.block_len_ = (size_t)*local_3e8.block_lengths_;
  }
  local_3e8.entropy_ix_ = 0;
  local_3e8.depths_ = (uint8_t *)0x0;
  local_3e8.bits_ = (uint16_t *)0x0;
  local_3e8.alphabet_size_ =
       (ulong)(num_direct_distance_codes + (0x30 << ((byte)distance_postfix_bits & 0x1f)) + 0x10);
  BuildAndStoreBlockSwitchEntropyCodes(&local_b58,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&local_7a0,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&local_3e8,tree,storage_ix,storage);
  if (distance_postfix_bits < 4) {
    uVar19 = *storage_ix;
    *(ulong *)(storage + (uVar19 >> 3)) =
         (ulong)distance_postfix_bits << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
    uVar8 = uVar19 + 2;
    *storage_ix = uVar8;
    uVar13 = num_direct_distance_codes >> ((byte)distance_postfix_bits & 0x1f);
    if (uVar13 < 0x10) {
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)uVar13 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      *storage_ix = uVar19 + 6;
      if ((mb->literal_split).num_types != 0) {
        uVar8 = 0;
        do {
          if (CONTEXT_SIGNED < literal_context_mode) goto LAB_001167da;
          uVar19 = *storage_ix;
          *(ulong *)(storage + (uVar19 >> 3)) =
               (ulong)literal_context_mode << ((byte)uVar19 & 7) | (ulong)storage[uVar19 >> 3];
          *storage_ix = uVar19 + 2;
          uVar8 = uVar8 + 1;
        } while (uVar8 < (mb->literal_split).num_types);
      }
      if (mb->literal_context_map_size == 0) {
        StoreTrivialContextMap(mb->literal_histograms_size,6,tree,storage_ix,storage);
      }
      else {
        EncodeContextMap(m,mb->literal_context_map,mb->literal_context_map_size,
                         mb->literal_histograms_size,tree,storage_ix,storage);
      }
      if (mb->distance_context_map_size == 0) {
        StoreTrivialContextMap(mb->distance_histograms_size,2,tree,storage_ix,storage);
      }
      else {
        EncodeContextMap(m,mb->distance_context_map,mb->distance_context_map_size,
                         mb->distance_histograms_size,tree,storage_ix,storage);
      }
      sVar10 = local_b58.alphabet_size_;
      histogram_00 = mb->literal_histograms;
      sVar11 = mb->literal_histograms_size;
      sVar18 = local_b58.alphabet_size_ * sVar11;
      if (sVar18 == 0) {
        local_b58.depths_ = (uint8_t *)0x0;
        local_b58.bits_ = (uint16_t *)0x0;
      }
      else {
        local_b58.depths_ = (uint8_t *)BrotliAllocate(m,sVar18);
        local_b58.bits_ = (uint16_t *)BrotliAllocate(m,sVar18 * 2);
      }
      if (sVar11 != 0) {
        lVar12 = 0;
        lVar20 = 0;
        do {
          BuildAndStoreHuffmanTree
                    (histogram_00->data_,sVar10,tree,local_b58.depths_ + lVar12,
                     (uint16_t *)((long)local_b58.bits_ + lVar20),storage_ix,storage);
          histogram_00 = histogram_00 + 1;
          lVar20 = lVar20 + sVar10 * 2;
          lVar12 = lVar12 + sVar10;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
      }
      sVar10 = local_7a0.alphabet_size_;
      histogram = mb->command_histograms;
      sVar11 = mb->command_histograms_size;
      sVar18 = local_7a0.alphabet_size_ * sVar11;
      if (sVar18 == 0) {
        local_7a0.depths_ = (uint8_t *)0x0;
        local_7a0.bits_ = (uint16_t *)0x0;
      }
      else {
        local_7a0.depths_ = (uint8_t *)BrotliAllocate(m,sVar18);
        local_7a0.bits_ = (uint16_t *)BrotliAllocate(m,sVar18 * 2);
      }
      if (sVar11 != 0) {
        lVar12 = 0;
        lVar20 = 0;
        do {
          BuildAndStoreHuffmanTree
                    (histogram->data_,sVar10,tree,local_7a0.depths_ + lVar12,
                     (uint16_t *)((long)local_7a0.bits_ + lVar20),storage_ix,storage);
          histogram = histogram + 1;
          lVar20 = lVar20 + sVar10 * 2;
          lVar12 = lVar12 + sVar10;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
      }
      sVar10 = local_3e8.alphabet_size_;
      histogram_01 = mb->distance_histograms;
      sVar11 = mb->distance_histograms_size;
      sVar18 = local_3e8.alphabet_size_ * sVar11;
      if (sVar18 == 0) {
        local_3e8.depths_ = (uint8_t *)0x0;
        local_3e8.bits_ = (uint16_t *)0x0;
      }
      else {
        local_3e8.depths_ = (uint8_t *)BrotliAllocate(m,sVar18);
        local_3e8.bits_ = (uint16_t *)BrotliAllocate(m,sVar18 * 2);
      }
      if (sVar11 != 0) {
        lVar12 = 0;
        lVar20 = 0;
        do {
          BuildAndStoreHuffmanTree
                    (histogram_01->data_,sVar10,tree,local_3e8.depths_ + lVar12,
                     (uint16_t *)((long)local_3e8.bits_ + lVar20),storage_ix,storage);
          histogram_01 = histogram_01 + 1;
          lVar20 = lVar20 + sVar10 * 2;
          lVar12 = lVar12 + sVar10;
          sVar11 = sVar11 - 1;
        } while (sVar11 != 0);
      }
      BrotliFree(m,tree);
      if (n_commands != 0) {
        local_ba0 = (ulong)prev_byte2;
        sVar11 = 0;
        do {
          uVar13 = commands[sVar11].insert_len_;
          uVar8 = (ulong)uVar13;
          uVar17 = commands[sVar11].copy_len_;
          uVar3 = commands[sVar11].dist_extra_;
          uVar1 = commands[sVar11].cmd_prefix_;
          uVar2 = commands[sVar11].dist_prefix_;
          StoreSymbol(&local_7a0,(ulong)uVar1,storage_ix,storage);
          uVar9 = uVar13;
          if (5 < uVar8) {
            if (uVar13 < 0x82) {
              uVar9 = 0x1f;
              uVar6 = (uint)(uVar8 - 2);
              if (uVar6 != 0) {
                for (; uVar6 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = (uVar9 ^ 0xffffffe0) * 2 +
                      (int)(uVar8 - 2 >> ((char)(uVar9 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x40;
            }
            else if (uVar13 < 0x842) {
              uVar9 = 0x1f;
              if (uVar13 - 0x42 != 0) {
                for (; uVar13 - 0x42 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = (uVar9 ^ 0xffffffe0) + 0x2a;
            }
            else {
              uVar9 = 0x15;
              if (0x1841 < uVar13) {
                uVar9 = 0x17 - (uVar13 < 0x5842);
              }
            }
          }
          uVar6 = uVar17 & 0xffffff;
          uVar17 = uVar17 >> 0x18 ^ uVar6;
          if (uVar17 < 10) {
            uVar14 = uVar17 + 0xfffe;
          }
          else if (uVar17 < 0x86) {
            uVar14 = 0x1f;
            uVar7 = (uint)((ulong)uVar17 - 6);
            if (uVar7 != 0) {
              for (; uVar7 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            uVar14 = (uVar14 ^ 0xffffffe0) * 2 +
                     (int)((ulong)uVar17 - 6 >> ((char)(uVar14 ^ 0xffffffe0) + 0x1fU & 0x3f)) + 0x42
            ;
          }
          else {
            uVar14 = 0x17;
            if (uVar17 < 0x846) {
              uVar14 = 0x1f;
              if (uVar17 - 0x46 != 0) {
                for (; uVar17 - 0x46 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                }
              }
              uVar14 = (uVar14 ^ 0xffffffe0) + 0x2c;
            }
          }
          uVar19 = (ulong)((uVar9 & 0xffff) << 2);
          iVar4 = *(int *)((long)kInsExtra + uVar19);
          uVar15 = (ulong)((uVar14 & 0xffff) << 2);
          uVar19 = (ulong)(uVar17 - *(int *)((long)kCopyBase + uVar15)) << ((byte)iVar4 & 0x3f) |
                   (ulong)(uVar13 - *(int *)((long)kInsBase + uVar19));
          uVar17 = iVar4 + *(int *)((long)kCopyExtra + uVar15);
          if (uVar19 >> ((byte)uVar17 & 0x3f) != 0) goto LAB_001167da;
          if (0x38 < uVar17) {
LAB_001167f9:
            __assert_fail("n_bits <= 56",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                          ,0x37,
                          "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)"
                         );
          }
          uVar15 = *storage_ix;
          *(ulong *)(storage + (uVar15 >> 3)) =
               uVar19 << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
          *storage_ix = uVar17 + uVar15;
          if (mb->literal_context_map_size == 0) {
            if (uVar13 != 0) {
              do {
                StoreSymbol(&local_b58,(ulong)input[start_pos & mask],storage_ix,storage);
                start_pos = start_pos + 1;
                uVar8 = uVar8 - 1;
              } while (uVar8 != 0);
            }
          }
          else if (uVar13 != 0) {
            do {
              uVar19 = uVar16;
              switch(literal_context_mode) {
              case CONTEXT_LSB6:
                bVar5 = (byte)uVar19 & 0x3f;
                break;
              case CONTEXT_MSB6:
                bVar5 = (byte)(uVar19 >> 2);
                break;
              case CONTEXT_UTF8:
                bVar5 = ""[local_ba0 + 0x100] | ""[uVar19];
                break;
              case CONTEXT_SIGNED:
                bVar5 = ""[uVar19] * '\b' + ""[local_ba0];
                break;
              default:
                bVar5 = 0;
              }
              uVar16 = (ulong)input[start_pos & mask];
              StoreSymbolWithContext
                        (&local_b58,(ulong)input[start_pos & mask],(ulong)bVar5,
                         mb->literal_context_map,storage_ix,storage,6);
              start_pos = start_pos + 1;
              uVar8 = uVar8 - 1;
              local_ba0 = uVar19;
            } while (uVar8 != 0);
          }
          start_pos = start_pos + uVar6;
          if (uVar6 != 0) {
            local_ba0 = (ulong)input[start_pos - 2 & mask];
            uVar16 = (ulong)input[start_pos - 1 & mask];
            if (0x7f < uVar1) {
              if (mb->distance_context_map_size == 0) {
                StoreSymbol(&local_3e8,(ulong)uVar2,storage_ix,storage);
              }
              else {
                uVar13 = uVar1 & 7;
                if (2 < uVar13) {
                  uVar13 = 3;
                }
                sVar10 = 3;
                if (((uVar1 >> 6) - 2 & 0xfffffffd) == 0) {
                  sVar10 = (ulong)uVar13;
                }
                if (uVar1 >> 6 == 7) {
                  sVar10 = (ulong)uVar13;
                }
                StoreSymbolWithContext
                          (&local_3e8,(ulong)uVar2,sVar10,mb->distance_context_map,storage_ix,
                           storage,2);
              }
              if ((uVar3 & 0xffffff) >> ((byte)(uVar3 >> 0x18) & 0x3f) != 0) goto LAB_001167da;
              if (0x38ffffff < uVar3) goto LAB_001167f9;
              uVar8 = *storage_ix;
              *(ulong *)(storage + (uVar8 >> 3)) =
                   (ulong)(uVar3 & 0xffffff) << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
              *storage_ix = (uVar3 >> 0x18) + uVar8;
            }
          }
          sVar11 = sVar11 + 1;
        } while (sVar11 != n_commands);
      }
      BrotliFree(m,local_3e8.depths_);
      local_3e8.depths_ = (uint8_t *)0x0;
      BrotliFree(m,local_3e8.bits_);
      local_3e8.bits_ = (uint16_t *)0x0;
      BrotliFree(m,local_7a0.depths_);
      local_7a0.depths_ = (uint8_t *)0x0;
      BrotliFree(m,local_7a0.bits_);
      local_7a0.bits_ = (uint16_t *)0x0;
      BrotliFree(m,local_b58.depths_);
      local_b58.depths_ = (uint8_t *)0x0;
      BrotliFree(m,local_b58.bits_);
      if (is_last != 0) {
        uVar13 = (int)*storage_ix + 7;
        *storage_ix = (ulong)(uVar13 & 0xfffffff8);
        storage[uVar13 >> 3] = '\0';
      }
      return;
    }
  }
LAB_001167da:
  __assert_fail("(bits >> n_bits) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,0x36,"void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)")
  ;
}

Assistant:

void BrotliStoreMetaBlock(MemoryManager* m,
                          const uint8_t* input,
                          size_t start_pos,
                          size_t length,
                          size_t mask,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          BROTLI_BOOL is_last,
                          uint32_t num_direct_distance_codes,
                          uint32_t distance_postfix_bits,
                          ContextType literal_context_mode,
                          const Command *commands,
                          size_t n_commands,
                          const MetaBlockSplit* mb,
                          size_t *storage_ix,
                          uint8_t *storage) {
  size_t pos = start_pos;
  size_t i;
  size_t num_distance_codes =
      BROTLI_NUM_DISTANCE_SHORT_CODES + num_direct_distance_codes +
      (48u << distance_postfix_bits);
  HuffmanTree* tree;
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  InitBlockEncoder(&literal_enc, 256, mb->literal_split.num_types,
      mb->literal_split.types, mb->literal_split.lengths,
      mb->literal_split.num_blocks);
  InitBlockEncoder(&command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(&distance_enc, num_distance_codes,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(
      &distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(4, num_direct_distance_codes >> distance_postfix_bits,
                  storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, &literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, &command_enc, mb->command_histograms,
      mb->command_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, &distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(&command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(&literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context = Context(prev_byte, prev_byte2, literal_context_mode);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(&literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_;
        uint32_t distnumextra = cmd.dist_extra_ >> 24;
        uint64_t distextra = cmd.dist_extra_ & 0xffffff;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(&distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, &distance_enc);
  CleanupBlockEncoder(m, &command_enc);
  CleanupBlockEncoder(m, &literal_enc);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}